

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

string * GrcManager::ExpressionDebugString_abi_cxx11_(ExpressionType expt)

{
  undefined4 in_ESI;
  string *in_RDI;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  switch(in_ESI) {
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"unknown",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
    break;
  case 1:
  case 4:
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"integer",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"boolean",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"em-units",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"slot-ref",&local_20);
    std::allocator<char>::~allocator((allocator<char> *)&local_20);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"string",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"point",&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"gid",&local_23);
    std::allocator<char>::~allocator((allocator<char> *)&local_23);
  }
  return in_RDI;
}

Assistant:

std::string GrcManager::ExpressionDebugString(ExpressionType expt)
{
	switch (expt)
	{
	default:
	case kexptUnknown:	return "unknown";
	case kexptZero:
	case kexptOne:
	case kexptNumber:	return "integer";
	case kexptBoolean:	return "boolean";
	case kexptMeas:		return "em-units";
	case kexptSlotRef:	return "slot-ref";
	case kexptString:	return "string";
	case kexptPoint:	return "point";
	case kexptGlyphID:	return "gid";
	}
}